

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O0

uint64_t fletcher2(char *key,int len,uint64_t seed)

{
  uint8_t *endc;
  uint8_t *datac;
  uint64_t B;
  uint64_t A;
  uint64_t *endw;
  uint64_t *dataw;
  uint64_t seed_local;
  int len_local;
  char *key_local;
  
  B = 0;
  A = seed;
  for (dataw = (uint64_t *)key; dataw < key + (long)(len / 8) * 8; dataw = dataw + 1) {
    A = *dataw + A;
    B = A + B;
  }
  if ((len & 7U) != 0) {
    for (datac = (uint8_t *)dataw; datac < key + len; datac = datac + 1) {
      A = *datac + A;
      B = A + B;
    }
  }
  return B;
}

Assistant:

uint64_t
fletcher2(const char *key, int len, uint64_t seed)
{
  uint64_t *dataw = (uint64_t *)key;
  const uint64_t *const endw = &((const uint64_t*)key)[len/8];
  uint64_t A = seed, B = 0;
  for (; dataw < endw; dataw++) {
    A += *dataw;
    B += A;
  }
  if (len & 7) {
    uint8_t *datac = (uint8_t*)dataw; //byte stepper
    const uint8_t *const endc = &((const uint8_t*)key)[len];
    for (; datac < endc; datac++) {
      A += *datac;
      B += A;
    }
  }
  return B;
}